

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::pairWith(AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  pointer pbVar2;
  uint uVar3;
  pointer pCVar4;
  iterator iVar5;
  pointer pmVar6;
  pointer pcVar7;
  pointer pcVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  size_t sVar10;
  string *psVar11;
  long lVar12;
  pointer pCVar13;
  AlignmentRecord *pAVar14;
  bool bVar15;
  int iVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality2;
  string querySequence;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref2;
  undefined1 local_3c8 [32];
  shared_count local_3a8;
  element_type *local_3a0;
  shared_count local_398;
  element_type *local_390;
  shared_count local_388;
  undefined1 local_378 [32];
  string *local_358;
  undefined1 local_350 [16];
  undefined1 local_340 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider local_318;
  shared_count local_310;
  undefined1 local_308 [40];
  string *local_2e0;
  vector<int,_std::allocator<int>_> *local_2d8;
  string *local_2d0;
  string *local_2c8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  vector<int,_std::allocator<int>_> local_290;
  vector<int,_std::allocator<int>_> local_278;
  vector<char,_std::allocator<char>_> local_260;
  vector<char,_std::allocator<char>_> local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar16 = *(int *)(alignment + 0xac);
  bVar15 = SUB81(alignment,0);
  if (this->end1 < iVar16 + 1U) {
    this->single_end = false;
    this->start2 = iVar16 + 1U;
    iVar16 = 0;
    local_2e0 = mainReference;
    uVar9 = BamTools::BamAlignment::GetEndPosition(bVar15,false);
    this->end2 = uVar9;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
    local_358 = (string *)(alignment + 0x68);
    if (*(long *)(alignment + 0x70) != 0) {
      lVar12 = 0;
      iVar16 = 0;
      do {
        iVar16 = iVar16 + (local_358->_M_dataplus)._M_p[lVar12] + -0x21;
        lVar12 = lVar12 + 1;
      } while (*(long *)(alignment + 0x70) != lVar12);
    }
    this->phred_sum2 = iVar16;
    pCVar13 = (this->cigar2).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar4 = (this->cigar2).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar13 != pCVar4) {
      do {
        if (pCVar13->Length != 0) {
          uVar9 = 0;
          do {
            iVar5._M_current =
                 (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                        ((vector<char,std::allocator<char>> *)&this->cigar2_unrolled,iVar5,
                         &pCVar13->Type);
            }
            else {
              *iVar5._M_current = pCVar13->Type;
              ppcVar1 = &(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
            uVar9 = uVar9 + 1;
            uVar3 = pCVar13->Length;
          } while (uVar9 < uVar3);
          if ((pCVar13->Type == 'D') &&
             (this->length_incl_deletions2 = this->length_incl_deletions2 + uVar3, 1 < uVar3)) {
            this->length_incl_longdeletions2 = this->length_incl_longdeletions2 + uVar3;
          }
        }
        pCVar13 = pCVar13 + 1;
      } while (pCVar13 != pCVar4);
    }
    local_378._0_8_ = (element_type *)(local_378 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_378,*(long *)(alignment + 0x28),
               *(long *)(alignment + 0x30) + *(long *)(alignment + 0x28));
    std::vector<char,_std::allocator<char>_>::vector(&local_248,&this->cigar2_unrolled);
    iVar16 = *(int *)(alignment + 0xac);
    pAVar14 = *(AlignmentRecord **)(alignment + 0x68);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pAVar14,
               (long)&(pAVar14->name)._M_dataplus._M_p + *(long *)(alignment + 0x70));
    referenceString((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)local_350,pAVar14,&local_248,iVar16,(string *)local_378,&local_110,local_2e0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_3c8,(string *)local_378,local_358);
    if ((pointer)local_3c8._16_8_ != (pointer)0x0) {
      LOCK();
      *(uint_least32_t *)(local_3c8._16_8_ + 8) = *(uint_least32_t *)(local_3c8._16_8_ + 8) + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence2).forward.px;
    local_308._24_8_ = (this->sequence2).forward.pn.pi_;
    (this->sequence2).forward.px = (element_type *)local_3c8._8_8_;
    (this->sequence2).forward.pn.pi_ = (sp_counted_base *)local_3c8._16_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    if (local_3a8.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_3a8.pi_)->use_count_ = (local_3a8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence2).forward_qualities.px;
    local_308._24_8_ = (this->sequence2).forward_qualities.pn.pi_;
    (this->sequence2).forward_qualities.px = (element_type *)local_3c8._24_8_;
    (this->sequence2).forward_qualities.pn.pi_ = local_3a8.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    if (local_398.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_398.pi_)->use_count_ = (local_398.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence2).backward.px;
    local_308._24_8_ = (this->sequence2).backward.pn.pi_;
    (this->sequence2).backward.px = local_3a0;
    (this->sequence2).backward.pn.pi_ = local_398.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    if (local_388.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_388.pi_)->use_count_ = (local_388.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence2).backward_qualities.px;
    local_308._24_8_ = (this->sequence2).backward_qualities.pn.pi_;
    (this->sequence2).backward_qualities.px = local_390;
    (this->sequence2).backward_qualities.pn.pi_ = local_388.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_3c8);
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    std::vector<int,_std::allocator<int>_>::operator=
              (&this->qualityList2,(vector<int,_std::allocator<int>_> *)local_350);
    sVar10 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_deletions2 = (int)sVar10;
    sVar10 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_longdeletions2 = (int)sVar10;
    coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                      *)local_3c8,this);
    pmVar6 = (this->cov_pos).
             super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3c8._16_8_;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (element_type *)0x0;
    local_3c8._16_8_ = (pointer)0x0;
    if ((pmVar6 != (pointer)0x0) &&
       (operator_delete(pmVar6), (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((element_type *)local_318._M_p != (element_type *)local_308) {
      operator_delete(local_318._M_p);
    }
    if ((element_type *)local_340._8_8_ != (element_type *)(local_340 + 0x18)) {
      operator_delete((void *)local_340._8_8_);
    }
    if ((pointer)local_350._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((element_type *)local_378._0_8_ == (element_type *)(local_378 + 0x10)) goto LAB_00170889;
  }
  else {
    iVar16 = 0;
    uVar9 = BamTools::BamAlignment::GetEndPosition(bVar15,false);
    if (this->start1 <= uVar9) {
      getMergedDnaSequence(this,alignment,mainReference);
      goto LAB_00170889;
    }
    this->single_end = false;
    this->start2 = this->start1;
    this->end2 = this->end1;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,&this->cigar1);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,&(this->sequence1).forward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,&(this->sequence1).forward_qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,&(this->sequence1).backward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,&(this->sequence1).backward_qualities);
    local_2c8 = (string *)&this->reference_seq1;
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    local_2d0 = (string *)&this->alignSequence1;
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    std::__cxx11::string::_M_assign((string *)&this->code2);
    local_2d8 = &this->qualityList1;
    std::vector<int,_std::allocator<int>_>::operator=(&this->qualityList2,local_2d8);
    this->phred_sum2 = this->phred_sum1;
    this_00 = &this->cigar1_unrolled;
    std::vector<char,_std::allocator<char>_>::operator=(&this->cigar2_unrolled,this_00);
    this->length_incl_deletions2 = this->length_incl_deletions1;
    this->length_incl_longdeletions2 = this->length_incl_longdeletions1;
    this->start1 = *(int *)(alignment + 0xac) + 1;
    uVar9 = BamTools::BamAlignment::GetEndPosition(bVar15,false);
    this->end1 = uVar9;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar1,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
    local_358 = (string *)(alignment + 0x68);
    if (*(long *)(alignment + 0x70) != 0) {
      lVar12 = 0;
      iVar16 = 0;
      do {
        iVar16 = iVar16 + (local_358->_M_dataplus)._M_p[lVar12] + -0x21;
        lVar12 = lVar12 + 1;
      } while (*(long *)(alignment + 0x70) != lVar12);
    }
    this->phred_sum1 = iVar16;
    pcVar7 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar7) {
      (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar7;
    }
    pCVar4 = (this->cigar1).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_2e0 = mainReference;
    for (pCVar13 = (this->cigar1).
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar13 != pCVar4; pCVar13 = pCVar13 + 1) {
      if (pCVar13->Length != 0) {
        uVar9 = 0;
        do {
          iVar5._M_current =
               (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar5,&pCVar13->Type);
          }
          else {
            *iVar5._M_current = pCVar13->Type;
            ppcVar1 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar9 = uVar9 + 1;
          uVar3 = pCVar13->Length;
        } while (uVar9 < uVar3);
        if ((pCVar13->Type == 'D') &&
           (this->length_incl_deletions1 = this->length_incl_deletions1 + uVar3, 1 < uVar3)) {
          this->length_incl_longdeletions1 = this->length_incl_longdeletions1 + uVar3;
        }
      }
    }
    local_378._0_8_ = (element_type *)(local_378 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_378,*(long *)(alignment + 0x28),
               *(long *)(alignment + 0x30) + *(long *)(alignment + 0x28));
    std::vector<char,_std::allocator<char>_>::vector(&local_260,this_00);
    iVar16 = *(int *)(alignment + 0xac);
    pAVar14 = *(AlignmentRecord **)(alignment + 0x68);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pAVar14,
               (long)&(pAVar14->name)._M_dataplus._M_p + *(long *)(alignment + 0x70));
    referenceString((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)local_350,pAVar14,&local_260,iVar16,(string *)local_378,&local_130,local_2e0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_260.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_260.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_3c8,(string *)local_378,local_358);
    if ((pointer)local_3c8._16_8_ != (pointer)0x0) {
      LOCK();
      *(uint_least32_t *)(local_3c8._16_8_ + 8) = *(uint_least32_t *)(local_3c8._16_8_ + 8) + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence1).forward.px;
    local_308._24_8_ = (this->sequence1).forward.pn.pi_;
    (this->sequence1).forward.px = (element_type *)local_3c8._8_8_;
    (this->sequence1).forward.pn.pi_ = (sp_counted_base *)local_3c8._16_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    if (local_3a8.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_3a8.pi_)->use_count_ = (local_3a8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence1).forward_qualities.px;
    local_308._24_8_ = (this->sequence1).forward_qualities.pn.pi_;
    (this->sequence1).forward_qualities.px = (element_type *)local_3c8._24_8_;
    (this->sequence1).forward_qualities.pn.pi_ = local_3a8.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    if (local_398.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_398.pi_)->use_count_ = (local_398.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence1).backward.px;
    local_308._24_8_ = (this->sequence1).backward.pn.pi_;
    (this->sequence1).backward.px = local_3a0;
    (this->sequence1).backward.pn.pi_ = local_398.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    if (local_388.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_388.pi_)->use_count_ = (local_388.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_308._16_8_ = (this->sequence1).backward_qualities.px;
    local_308._24_8_ = (this->sequence1).backward_qualities.pn.pi_;
    (this->sequence1).backward_qualities.px = local_390;
    (this->sequence1).backward_qualities.pn.pi_ = local_388.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x18));
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_3c8);
    std::__cxx11::string::_M_assign(local_2c8);
    std::__cxx11::string::_M_assign(local_2d0);
    std::vector<int,_std::allocator<int>_>::operator=
              (local_2d8,(vector<int,_std::allocator<int>_> *)local_350);
    sVar10 = ShortDnaSequence::size(&this->sequence1);
    this->length_incl_deletions1 = (int)sVar10;
    sVar10 = ShortDnaSequence::size(&this->sequence1);
    this->length_incl_longdeletions1 = (int)sVar10;
    coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                      *)local_3c8,this);
    pmVar6 = (this->cov_pos).
             super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3c8._16_8_;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (element_type *)0x0;
    local_3c8._16_8_ = (pointer)0x0;
    if ((pmVar6 != (pointer)0x0) &&
       (operator_delete(pmVar6), (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((element_type *)local_318._M_p != (element_type *)local_308) {
      operator_delete(local_318._M_p);
    }
    if ((element_type *)local_340._8_8_ != (element_type *)(local_340 + 0x18)) {
      operator_delete((void *)local_340._8_8_);
    }
    if ((pointer)local_350._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((element_type *)local_378._0_8_ == (element_type *)(local_378 + 0x10)) goto LAB_00170889;
  }
  operator_delete((void *)local_378._0_8_);
LAB_00170889:
  if (this->strand1 == true) {
    pcVar8 = (this->reference_seq1)._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar8,pcVar8 + (this->reference_seq1)._M_string_length);
    pcVar8 = (this->alignSequence1)._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar8,pcVar8 + (this->alignSequence1)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_278,&this->qualityList1);
    CTandCTOTReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_350,&local_150,&local_170,&local_278,'G','C','T');
    if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code1);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality1);
    pcVar8 = (this->reference_seq2)._M_dataplus._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar8,pcVar8 + (this->reference_seq2)._M_string_length);
    pcVar8 = (this->alignSequence2)._M_dataplus._M_p;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar8,pcVar8 + (this->alignSequence2)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_290,&this->qualityList2);
    CTandCTOTReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,&local_190,&local_1b0,&local_290,'G','C','T');
    if (local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality2);
  }
  else {
    psVar11 = ShortDnaSequence::toString_abi_cxx11_(&this->sequence1);
    pcVar8 = (psVar11->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar8,pcVar8 + psVar11->_M_string_length);
    complement((string *)local_3c8,&local_50);
    psVar11 = ShortDnaSequence::qualityString_abi_cxx11_(&this->sequence1);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_350,(string *)local_3c8,psVar11);
    if ((pointer)local_340._0_8_ != (pointer)0x0) {
      LOCK();
      *(uint_least32_t *)(local_340._0_8_ + 8) = *(uint_least32_t *)(local_340._0_8_ + 8) + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence1).forward.px;
    local_378._8_8_ = (this->sequence1).forward.pn.pi_;
    (this->sequence1).forward.px = (element_type *)local_350._8_8_;
    (this->sequence1).forward.pn.pi_ = (sp_counted_base *)local_340._0_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    if ((sp_counted_base *)local_340._16_8_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_340._16_8_ + 8) = *(uint_least32_t *)(local_340._16_8_ + 8) + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence1).forward_qualities.px;
    local_378._8_8_ = (this->sequence1).forward_qualities.pn.pi_;
    (this->sequence1).forward_qualities.px = (element_type *)local_340._8_8_;
    (this->sequence1).forward_qualities.pn.pi_ = (sp_counted_base *)local_340._16_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    if ((sp_counted_base *)local_328._8_8_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_328._8_8_ + 8) = *(uint_least32_t *)(local_328._8_8_ + 8) + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence1).backward.px;
    local_378._8_8_ = (this->sequence1).backward.pn.pi_;
    (this->sequence1).backward.px = (element_type *)local_328._M_allocated_capacity;
    (this->sequence1).backward.pn.pi_ = (sp_counted_base *)local_328._8_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    if (local_310.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_310.pi_)->use_count_ = (local_310.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence1).backward_qualities.px;
    local_378._8_8_ = (this->sequence1).backward_qualities.pn.pi_;
    (this->sequence1).backward_qualities.px = (element_type *)local_318._M_p;
    (this->sequence1).backward_qualities.pn.pi_ = local_310.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_350);
    if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pcVar8 = (this->reference_seq1)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar8,pcVar8 + (this->reference_seq1)._M_string_length);
    complement((string *)local_350,&local_70);
    std::__cxx11::string::operator=((string *)&this->reference_seq1,(string *)local_350);
    pbVar2 = (pointer)(local_350 + 0x10);
    if ((pointer)local_350._0_8_ != pbVar2) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pcVar8 = (this->alignSequence1)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar8,pcVar8 + (this->alignSequence1)._M_string_length);
    complement((string *)local_350,&local_90);
    std::__cxx11::string::operator=((string *)&this->alignSequence1,(string *)local_350);
    if ((pointer)local_350._0_8_ != pbVar2) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    psVar11 = ShortDnaSequence::toString_abi_cxx11_(&this->sequence2);
    pcVar8 = (psVar11->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar8,pcVar8 + psVar11->_M_string_length);
    complement((string *)local_3c8,&local_b0);
    psVar11 = ShortDnaSequence::qualityString_abi_cxx11_(&this->sequence2);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_350,(string *)local_3c8,psVar11);
    if ((pointer)local_340._0_8_ != (pointer)0x0) {
      LOCK();
      *(uint_least32_t *)(local_340._0_8_ + 8) = *(uint_least32_t *)(local_340._0_8_ + 8) + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence2).forward.px;
    local_378._8_8_ = (this->sequence2).forward.pn.pi_;
    (this->sequence2).forward.px = (element_type *)local_350._8_8_;
    (this->sequence2).forward.pn.pi_ = (sp_counted_base *)local_340._0_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    if ((sp_counted_base *)local_340._16_8_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_340._16_8_ + 8) = *(uint_least32_t *)(local_340._16_8_ + 8) + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence2).forward_qualities.px;
    local_378._8_8_ = (this->sequence2).forward_qualities.pn.pi_;
    (this->sequence2).forward_qualities.px = (element_type *)local_340._8_8_;
    (this->sequence2).forward_qualities.pn.pi_ = (sp_counted_base *)local_340._16_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    if ((sp_counted_base *)local_328._8_8_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_328._8_8_ + 8) = *(uint_least32_t *)(local_328._8_8_ + 8) + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence2).backward.px;
    local_378._8_8_ = (this->sequence2).backward.pn.pi_;
    (this->sequence2).backward.px = (element_type *)local_328._M_allocated_capacity;
    (this->sequence2).backward.pn.pi_ = (sp_counted_base *)local_328._8_8_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    if (local_310.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_310.pi_)->use_count_ = (local_310.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_378._0_8_ = (this->sequence2).backward_qualities.px;
    local_378._8_8_ = (this->sequence2).backward_qualities.pn.pi_;
    (this->sequence2).backward_qualities.px = (element_type *)local_318._M_p;
    (this->sequence2).backward_qualities.pn.pi_ = local_310.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_378 + 8));
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_350);
    if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pcVar8 = (this->reference_seq2)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar8,pcVar8 + (this->reference_seq2)._M_string_length);
    complement((string *)local_350,&local_d0);
    std::__cxx11::string::operator=((string *)&this->reference_seq2,(string *)local_350);
    if ((pointer)local_350._0_8_ != pbVar2) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pcVar8 = (this->alignSequence2)._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar8,pcVar8 + (this->alignSequence2)._M_string_length);
    complement((string *)local_350,&local_f0);
    std::__cxx11::string::operator=((string *)&this->alignSequence2,(string *)local_350);
    if ((pointer)local_350._0_8_ != pbVar2) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    pcVar8 = (this->reference_seq1)._M_dataplus._M_p;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar8,pcVar8 + (this->reference_seq1)._M_string_length);
    pcVar8 = (this->alignSequence1)._M_dataplus._M_p;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar8,pcVar8 + (this->alignSequence1)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_2a8,&this->qualityList1);
    OBandCTOBReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_350,&local_1d0,&local_1f0,&local_2a8,'G','C','T');
    if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code1);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality1);
    pcVar8 = (this->reference_seq2)._M_dataplus._M_p;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar8,pcVar8 + (this->reference_seq2)._M_string_length);
    pcVar8 = (this->alignSequence2)._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar8,pcVar8 + (this->alignSequence2)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_2c0,&this->qualityList2);
    OBandCTOBReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,&local_210,&local_230,&local_2c0,'G','C','T');
    if (local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_350);
  return;
}

Assistant:

void AlignmentRecord::pairWith(const BamTools::BamAlignment& alignment, string &mainReference) {

    if ((unsigned)(alignment.Position+1) > this->end1) {
        this->single_end = false;
        this->start2 = alignment.Position + 1;
        this->end2 = alignment.GetEndPosition();
        if (!(this->end2 > 0)){
            //cout << this->name << " end: " << this->end2 << endl;
        }
        this->cigar2 = alignment.CigarData;

        this->phred_sum2 = phred_sum(alignment.Qualities);


        for (const auto& it : cigar2) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar2_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions2+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions2+=it.Length;
                }
            }
        }
        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref2 = referenceString(this->getCigar2Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence2 = ShortDnaSequence(querySequence, alignment.Qualities);

        this->reference_seq2=std::get<0>(ref2);
        this->alignSequence2=std::get<1>(ref2);
        this->qualityList2 = std::get<2>(ref2);

        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        //End NoMe Additions
        this->cov_pos = this->coveredPositions();

    } else if ((unsigned)alignment.GetEndPosition() < this->start1) {
        this->single_end = false;
        this->start2 = this->start1;
        this->end2 = this->end1;
        this->cigar2 = this->cigar1;
        this->sequence2 = this->sequence1;
        this->reference_seq2 = this->reference_seq1;
        this->alignSequence2 = this->alignSequence1;
        this->code2 = this->code1;
        this->qualityList2 = this->qualityList1;
        this->phred_sum2 = this->phred_sum1;
        this->cigar2_unrolled = this->cigar1_unrolled;
        this->length_incl_deletions2 = this->length_incl_deletions1;
        this->length_incl_longdeletions2 = this->length_incl_longdeletions1;

        this->start1 = alignment.Position + 1;
        this->end1 = alignment.GetEndPosition();
        this->cigar1 = alignment.CigarData;

        this->phred_sum1 = phred_sum(alignment.Qualities);

        this->cigar1_unrolled.clear();
        for (const auto& it : cigar1) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar1_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions1+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions1+=it.Length;
                }
            }
        }

        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref3 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);
        this->reference_seq1 = std::get<0>(ref3);
        this->alignSequence1 = std::get<1>(ref3);
        this->qualityList1 = std::get<2>(ref3);

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();

        //End NoMe Additions
        this->cov_pos = this->coveredPositions();
        if(this->reference_seq1.size()-1!=this->cigar1_unrolled.size()){
            assert(false);
        }
    }//merging of overlapping paired ends to single end reads
    else {
        this->getMergedDnaSequence(alignment,mainReference);
    }

    //Reverse Complementing the pair 1 and two based on which strand they come from
    if(this->isStrand1()){
            //OT and CTOT reads, no need to complement these reads as they are already in the forward direction
            std::vector<string> codesAndQuality1 = CTandCTOTReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = CTandCTOTReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }else if(!this->strand1){
            //OB and CTOB reads. We need to complement these reads since we want the original reverse strand reads
            this->sequence1 = ShortDnaSequence(complement(this->sequence1.toString()), this->sequence1.qualityString());
            this->reference_seq1 = complement(this->reference_seq1);
            this->alignSequence1 = complement(this->alignSequence1);
            this->sequence2 = ShortDnaSequence(complement(this->sequence2.toString()), this->sequence2.qualityString());
            this->reference_seq2 = complement(this->reference_seq2);
            this->alignSequence2 = complement(this->alignSequence2);
            vector<string> codesAndQuality1 = OBandCTOBReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = OBandCTOBReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }
}